

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O2

AtomSpan __thiscall Potassco::SmodelsConvert::SmData::mapHead(SmData *this,AtomSpan *h)

{
  AtomVec *this_00;
  pointer puVar1;
  Atom_t *pAVar2;
  Atom_t *pAVar3;
  Span<unsigned_int> SVar4;
  AtomSpan AVar5;
  Atom_t local_30;
  uint local_2c;
  
  puVar1 = (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  this_00 = &this->head_;
  pAVar2 = h->first;
  for (pAVar3 = pAVar2; pAVar3 != pAVar2 + h->size; pAVar3 = pAVar3 + 1) {
    local_30 = mapHeadAtom(this,*pAVar3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,&local_30);
    pAVar2 = h->first;
  }
  if ((this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_2c = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,&local_2c);
  }
  SVar4 = toSpan<std::vector<unsigned_int,std::allocator<unsigned_int>>>(this_00);
  AVar5.first = SVar4.first;
  AVar5.size = SVar4.size;
  return AVar5;
}

Assistant:

AtomSpan SmodelsConvert::SmData::mapHead(const AtomSpan& h) {
	head_.clear();
	for (const Atom_t* x = begin(h); x != end(h); ++x) {
		head_.push_back(mapHeadAtom(*x));
	}
	if (head_.empty()) { head_.push_back(falseAtom()); }
	return toSpan(head_);
}